

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl.cpp
# Opt level: O2

int __thiscall musicBlock::releaseChannel(musicBlock *this,uint slot,uint killed)

{
  writeFrequency(this,slot,(uint)this->channels[slot].realnote,this->channels[slot].pitch,0);
  this->channels[slot].channel = this->channels[slot].channel | 0x80;
  this->channels[slot].time = this->MLtime;
  this->channels[slot].flags = 0x80;
  if (killed != 0) {
    OPLio::OPLwriteChannel(this->io,0x80,slot,'\x0f','\x0f');
    OPLio::OPLwriteChannel(this->io,0x40,slot,'?','?');
  }
  return slot;
}

Assistant:

int musicBlock::releaseChannel(uint slot, uint killed)
{
	struct channelEntry *ch = &channels[slot];
	writeFrequency(slot, ch->realnote, ch->pitch, 0);
	ch->channel |= CH_FREE;
	ch->time = MLtime;
	ch->flags = CH_FREE;
	if (killed)
	{
		io->OPLwriteChannel(0x80, slot, 0x0F, 0x0F);  // release rate - fastest
		io->OPLwriteChannel(0x40, slot, 0x3F, 0x3F);  // no volume
	}
	return slot;
}